

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::GenerateByteSize
          (RepeatedPrimitive *this,Printer *p)

{
  undefined1 auVar1 [8];
  bool bVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  void *unaff_RBP;
  long lVar4;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  undefined1 *apuStack_210 [2];
  long alStack_200 [2];
  anon_class_1_0_00000001 local_1e9;
  undefined1 local_1e8 [8];
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [40];
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  alStack_200[0] = 0xe7fb56;
  local_1e8 = (undefined1  [8])p;
  bVar2 = HasCachedSize(this);
  auVar1 = local_1e8;
  if (!bVar2) {
    alStack_200[0] = 0xe7fbbc;
    local_1e0 = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"data_size","");
    local_1a0._0_8_ = local_1a0 + 0x10;
    if (local_1e0 == &local_1d0) {
      local_1a0._24_8_ = uStack_1c8;
    }
    else {
      local_1a0._0_8_ = local_1e0;
    }
    local_1a0._8_8_ = local_1d8;
    local_1d8 = 0;
    local_1d0 = 0;
    alStack_200[0] = 0xe7fc10;
    local_1e0 = &local_1d0;
    local_1a0._32_8_ = operator_new(0x18);
    *(RepeatedPrimitive **)local_1a0._32_8_ = this;
    *(undefined1 **)(local_1a0._32_8_ + 8) = local_1e8;
    *(undefined1 *)(local_1a0._32_8_ + 0x10) = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    uStack_178 = 0;
    local_170 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_160 = 1;
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    alStack_200[0] = 0xe7fc85;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x1258832);
    local_f0 = 0;
    alStack_200[0] = 0xe7fcb2;
    local_1c0 = &local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"tag_size","");
    local_e8 = local_d8;
    if (local_1c0 == &local_1b0) {
      uStack_d0 = uStack_1a8;
    }
    else {
      local_e8 = local_1c0;
    }
    local_e0 = local_1b8;
    local_1b8 = 0;
    local_1b0 = 0;
    alStack_200[0] = 0xe7fd10;
    local_1c0 = &local_1b0;
    local_c8 = (undefined8 *)operator_new(0x18);
    *local_c8 = this;
    local_c8[1] = local_1e8;
    *(undefined1 *)(local_c8 + 2) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    uStack_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    alStack_200[0] = 0xe7fd8d;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x1258832);
    local_38 = 0;
    alStack_200[0] = 0xe7fdb2;
    io::Printer::Emit((Printer *)auVar1,local_1a0,2,0x85,
                      "\n        ::size_t data_size = $data_size$;\n        ::size_t tag_size = $tag_size$;\n        total_size += tag_size + data_size;\n      "
                     );
    lVar4 = 0x170;
    do {
      if (*(char *)((long)&uStack_1a8 + lVar4) == '\x01') {
        alStack_200[0] = 0xe7fdd9;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_1e8 + lVar4));
      }
      if ((long *)((long)alStack_200 + lVar4) != *(long **)((long)apuStack_210 + lVar4)) {
        alStack_200[0] = 0xe7fdf5;
        operator_delete(*(long **)((long)apuStack_210 + lVar4),
                        *(long *)((long)alStack_200 + lVar4) + 1);
      }
      alStack_200[0] = 0xe7fe08;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)apuStack_210 + lVar4 + -8)]._M_data)
                (&local_1e9,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar4));
      plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
      *(undefined1 *)((long)apuStack_210 + lVar4 + -8) = 0xff;
      if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
        alStack_200[0] = 0xe7fe28;
        operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
      }
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != 0);
    if (local_1c0 != &local_1b0) {
      alStack_200[0] = 0xe7fe48;
      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
    }
    if (local_1e0 != &local_1d0) {
      alStack_200[0] = 0xe7fe64;
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    return;
  }
  alStack_200[0] = 0xe7fb63;
  bVar2 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
  if (!bVar2) {
    alStack_200[0] = 0xe7fe80;
    cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateByteSize();
    lVar4 = 0xb8;
    do {
      alStack_200[0] = 0xe7fe9d;
      io::Printer::Sub::~Sub((Sub *)(local_1a0 + lVar4));
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != -0xb8);
    if (local_1c0 != (undefined1 *)unaff_RBP) {
      alStack_200[0] = 0xe7ff16;
      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
    }
    if (local_1e0 != &local_1d0) {
      alStack_200[0] = 0xe7ff83;
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    alStack_200[0] = (long)&LAB_00e7ffbc;
    _Unwind_Resume(extraout_RAX);
  }
  io::Printer::Emit((Printer *)local_1e8,0,0,0xda,
                    "\n          total_size +=\n              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(\n                  this_._internal_$name$(), $kTagBytes$,\n                  this_.$_field_cached_byte_size_$);\n        "
                   );
  return;
}

Assistant:

void RepeatedPrimitive::GenerateByteSize(io::Printer* p) const {
  if (HasCachedSize()) {
    ABSL_CHECK(field_->is_packed());
    p->Emit(
        R"cc(
          total_size +=
              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(
                  this_._internal_$name$(), $kTagBytes$,
                  this_.$_field_cached_byte_size_$);
        )cc");
    return;
  }
  p->Emit(
      {
          {"data_size",
           [&] {
             auto fixed_size = FixedSize(field_->type());
             if (fixed_size.has_value()) {
               p->Emit({{"kFixed", *fixed_size}}, R"cc(
                 ::size_t{$kFixed$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
          {"tag_size",
           [&] {
             if (field_->is_packed()) {
               p->Emit(R"cc(
                 data_size == 0
                     ? 0
                     : $kTagBytes$ + ::_pbi::WireFormatLite::Int32Size(
                                         static_cast<::int32_t>(data_size));
               )cc");
             } else {
               p->Emit(R"cc(
                 ::size_t{$kTagBytes$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             }
           }},
      },
      R"cc(
        ::size_t data_size = $data_size$;
        ::size_t tag_size = $tag_size$;
        total_size += tag_size + data_size;
      )cc");
}